

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O3

utf8proc_ssize_t
seqindex_write_char_decomposed
          (utf8proc_uint16_t seqindex,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  ushort *puVar1;
  ushort uVar2;
  bool bVar3;
  ulong uVar4;
  utf8proc_ssize_t uVar5;
  ushort *puVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  int iVar8;
  int iVar9;
  long lVar10;
  
  uVar4 = (ulong)((uint)CONCAT62(in_register_0000003a,seqindex) & 0x1fff);
  puVar6 = utf8proc_sequences + uVar4;
  uVar7 = (uint)(CONCAT62(in_register_0000003a,seqindex) >> 0xd) & 0x7ffff;
  if (uVar7 == 7) {
    uVar7 = (uint)*puVar6;
    puVar6 = utf8proc_sequences + uVar4 + 1;
  }
  lVar10 = 0;
  iVar8 = uVar7 + 1;
  while( true ) {
    uVar2 = *puVar6;
    uVar7 = (uint)uVar2;
    if ((uVar7 & 0xf800) == 0xd800) {
      puVar1 = puVar6 + 1;
      puVar6 = puVar6 + 1;
      uVar7 = (uVar2 & 0x3ff) * 0x400 + (*puVar1 & 0x3ff) + 0x10000;
    }
    uVar5 = bufsize - lVar10;
    if (uVar5 == 0 || bufsize < lVar10) {
      uVar5 = 0;
    }
    uVar5 = utf8proc_decompose_char(uVar7,dst + lVar10,uVar5,options,last_boundclass);
    lVar10 = lVar10 + uVar5;
    if (lVar10 < 0) break;
    puVar6 = puVar6 + 1;
    iVar9 = iVar8 + -1;
    bVar3 = iVar8 < 1;
    iVar8 = iVar9;
    if (iVar9 == 0 || bVar3) {
      return lVar10;
    }
  }
  return -2;
}

Assistant:

static utf8proc_ssize_t seqindex_write_char_decomposed(utf8proc_uint16_t seqindex, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  utf8proc_ssize_t written = 0;
  const utf8proc_uint16_t *entry = &utf8proc_sequences[seqindex & 0x1FFF];
  int len = seqindex >> 13;
  if (len >= 7) {
    len = *entry;
    entry++;
  }
  for (; len >= 0; entry++, len--) {
    utf8proc_int32_t entry_cp = seqindex_decode_entry(&entry);

    written += utf8proc_decompose_char(entry_cp, dst+written,
      (bufsize > written) ? (bufsize - written) : 0, options,
    last_boundclass);
    if (written < 0) return UTF8PROC_ERROR_OVERFLOW;
  }
  return written;
}